

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::BuildNode::configureAttribute
          (BuildNode *this,ConfigureContext *ctx,StringRef name,ArrayRef<llvm::StringRef> values)

{
  ArrayRef<llvm::StringRef> values_00;
  ArrayRef<llvm::StringRef> values_01;
  ConfigureContext *this_00;
  bool bVar1;
  bool local_229;
  Twine local_210;
  Twine local_1f8;
  Twine local_1e0;
  BuildNode *local_1c8;
  StringRef *local_1c0;
  StringList local_1b8;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_1a8;
  char *local_190 [2];
  void *local_180;
  size_t local_178;
  BuildNode *local_170;
  StringRef *local_168;
  StringList local_160;
  char *local_150 [2];
  char *local_140;
  size_t local_138;
  ConfigureContext *local_130;
  ConfigureContext *ctx_local;
  BuildNode *this_local;
  ArrayRef<llvm::StringRef> values_local;
  StringRef name_local;
  void *local_d8;
  size_t local_d0;
  char *local_c8;
  size_t local_c0;
  char *local_b8;
  size_t local_b0;
  char *local_a8;
  size_t local_a0;
  char *local_98;
  char **local_90;
  char *local_88;
  char **local_80;
  char **local_78;
  char *local_70;
  size_t local_68;
  void **local_60;
  char *local_58;
  size_t local_50;
  size_t local_48;
  char *local_40;
  void *local_38;
  int local_2c;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  values_local.Data = (StringRef *)values.Length;
  this_local = (BuildNode *)values.Data;
  local_140 = name.Data;
  local_90 = local_150;
  local_98 = "content-exclusion-patterns";
  local_150[0] = "content-exclusion-patterns";
  local_138 = name.Length;
  local_130 = ctx;
  ctx_local = (ConfigureContext *)this;
  values_local.Length = (size_type)local_140;
  local_c0 = strlen("content-exclusion-patterns");
  local_a8 = local_140;
  local_a0 = local_138;
  local_b8 = local_150[0];
  local_c8 = local_150[0];
  local_70 = local_150[0];
  local_78 = &local_a8;
  local_229 = false;
  local_b0 = local_c0;
  local_68 = local_c0;
  if (local_138 == local_c0) {
    local_18 = local_140;
    local_20 = local_150[0];
    local_28 = local_c0;
    if (local_c0 == 0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_140,local_150[0],local_c0);
    }
    local_229 = local_c == 0;
  }
  if (local_229) {
    local_170 = this_local;
    local_168 = values_local.Data;
    values_01.Length = (size_type)values_local.Data;
    values_01.Data = (StringRef *)this_local;
    basic::StringList::StringList<llvm::StringRef>(&local_160,values_01);
    basic::StringList::operator=(&this->exclusionPatterns,&local_160);
    basic::StringList::~StringList(&local_160);
    name_local.Length._7_1_ = true;
  }
  else {
    local_180 = (void *)values_local.Length;
    local_80 = local_190;
    local_88 = "must-scan-after-paths";
    local_190[0] = "must-scan-after-paths";
    local_178 = name.Length;
    local_50 = strlen("must-scan-after-paths");
    local_d8 = local_180;
    local_d0 = local_178;
    local_58 = local_190[0];
    local_60 = &local_d8;
    bVar1 = false;
    if (local_178 == local_50) {
      local_38 = local_180;
      local_40 = local_190[0];
      local_48 = local_50;
      if (local_50 == 0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp(local_180,local_190[0],local_50);
      }
      bVar1 = local_2c == 0;
    }
    this_00 = local_130;
    if (bVar1) {
      local_1c8 = this_local;
      local_1c0 = values_local.Data;
      values_00.Length = (size_type)values_local.Data;
      values_00.Data = (StringRef *)this_local;
      basic::StringList::StringList<llvm::StringRef>(&local_1b8,values_00);
      basic::StringList::getValues(&local_1a8,&local_1b8);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::operator=
                (&this->mustScanAfterPaths,&local_1a8);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_1a8);
      basic::StringList::~StringList(&local_1b8);
      name_local.Length._7_1_ = true;
    }
    else {
      llvm::operator+(&local_1f8,"unexpected attribute: \'",(StringRef *)&values_local.Length);
      llvm::Twine::Twine(&local_210,"\'");
      llvm::operator+(&local_1e0,&local_1f8,&local_210);
      ConfigureContext::error(this_00,&local_1e0);
      name_local.Length._7_1_ = false;
    }
  }
  return name_local.Length._7_1_;
}

Assistant:

bool BuildNode::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                   ArrayRef<StringRef> values) {
  if (name == "content-exclusion-patterns") {
    exclusionPatterns = basic::StringList(values);
    return true;
  } else if (name == "must-scan-after-paths") {
    mustScanAfterPaths = basic::StringList(values).getValues();
    return true;
  }

  // We don't support any other custom attributes.
  ctx.error("unexpected attribute: '" + name + "'");
  return false;
}